

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdict.cpp
# Opt level: O0

int __thiscall CVmObjDict::getp_find(CVmObjDict *this,vm_obj_id_t param_2,vm_val_t *val,uint *argc)

{
  int iVar1;
  vm_obj_id_t obj;
  vm_val_t *valstrval;
  char *pcVar2;
  size_t len;
  vm_dict_ext *cb;
  uint *in_RCX;
  find_ctx *in_RDX;
  CVmHashTable *in_RDI;
  find_ctx ctx;
  uint hash;
  vm_prop_id_t voc_prop;
  size_t strl;
  char *strp;
  vm_val_t *arg1;
  vm_val_t *arg0;
  uint orig_argc;
  vm_val_t *in_stack_ffffffffffffff28;
  uint *in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  uint hash_00;
  find_ctx *in_stack_ffffffffffffff70;
  vm_prop_id_t local_5a;
  vm_val_t *in_stack_ffffffffffffffb8;
  uint n;
  undefined4 in_stack_ffffffffffffffcc;
  
  if ((getp_find(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') &&
     (iVar1 = __cxa_guard_acquire(&getp_find(unsigned_int,vm_val_t*,unsigned_int*)::desc),
     iVar1 != 0)) {
    CVmNativeCodeDesc::CVmNativeCodeDesc(&getp_find::desc,1,1);
    __cxa_guard_release(&getp_find(unsigned_int,vm_val_t*,unsigned_int*)::desc);
  }
  if (in_RCX == (uint *)0x0) {
    hash_00 = 0;
  }
  else {
    hash_00 = *in_RCX;
  }
  n = hash_00;
  iVar1 = CVmObject::get_prop_check_argc
                    ((vm_val_t *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                     in_stack_ffffffffffffff30,(CVmNativeCodeDesc *)in_stack_ffffffffffffff28);
  if (iVar1 == 0) {
    valstrval = CVmStack::get(0);
    pcVar2 = vm_val_t::get_as_string(in_stack_ffffffffffffff28);
    if (pcVar2 == (char *)0x0) {
      err_throw(0);
    }
    len = vmb_get_len((char *)0x327975);
    pcVar2 = pcVar2 + 2;
    if (n < 2) {
      local_5a = 0;
    }
    else {
      in_stack_ffffffffffffffb8 = CVmStack::get(1);
      if (in_stack_ffffffffffffffb8->typ == VM_NIL) {
        local_5a = 0;
      }
      else {
        if (in_stack_ffffffffffffffb8->typ != VM_PROP) {
          err_throw(0);
        }
        local_5a = (in_stack_ffffffffffffffb8->val).prop;
      }
    }
    calc_str_hash((CVmObjDict *)CONCAT44(in_stack_ffffffffffffffcc,n),valstrval,
                  (char *)in_stack_ffffffffffffffb8,(size_t)pcVar2);
    find_ctx::find_ctx((find_ctx *)&stack0xffffffffffffff58,(CVmObjDict *)in_RDI,valstrval,pcVar2,
                       len,local_5a);
    cb = get_ext((CVmObjDict *)in_RDI);
    CVmHashTable::enum_hash_matches
              (in_RDI,hash_00,(_func_void_void_ptr_CVmHashEntry_ptr *)cb,
               (void *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    obj = find_ctx::results_to_list(in_stack_ffffffffffffff70);
    vm_val_t::set_obj((vm_val_t *)in_RDX,obj);
    CVmStack::discard(n);
    find_ctx::~find_ctx(in_RDX);
  }
  return 1;
}

Assistant:

int CVmObjDict::getp_find(VMG_ vm_obj_id_t, vm_val_t *val, uint *argc)
{
    static CVmNativeCodeDesc desc(1, 1);
    uint orig_argc = (argc != 0 ? *argc : 0);
    vm_val_t *arg0;
    vm_val_t *arg1;
    const char *strp;
    size_t strl;
    vm_prop_id_t voc_prop;
    unsigned int hash;

    /* check arguments */
    if (get_prop_check_argc(val, argc, &desc))
        return TRUE;

    /* 
     *   make sure the first argument is a string, but leave it on the stack
     *   for gc protection 
     */
    arg0 = G_stk->get(0);
    if ((strp = arg0->get_as_string(vmg0_)) == 0)
        err_throw(VMERR_STRING_VAL_REQD);

    /* scan and skip the string's length prefix */
    strl = vmb_get_len(strp);
    strp += VMB_LEN;

    /* 
     *   get the property ID, which can be omitted or specified as nil to
     *   indicate any property 
     */
    if (orig_argc < 2)
        voc_prop = VM_INVALID_PROP;
    else if ((arg1 = G_stk->get(1))->typ == VM_NIL)
        voc_prop = VM_INVALID_PROP;
    else if (arg1->typ == VM_PROP)
        voc_prop = arg1->val.prop;
    else
        err_throw(VMERR_PROPPTR_VAL_REQD);

    /* calculate the hash value */
    hash = calc_str_hash(vmg_ arg0, strp, strl);

    /* enumerate everything that matches the string's hash code */
    find_ctx ctx(vmg_ this, arg0, strp, strl, voc_prop);
    get_ext()->hashtab_->enum_hash_matches(hash, &find_cb, &ctx);

    /* build a list out of the results, and return the list */
    val->set_obj(ctx.results_to_list(vmg0_));

    /* discard arguments */
    G_stk->discard(orig_argc);

    /* success */
    return TRUE;
}